

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,TextureCubeArrayView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,IVec4 *coordBits,
              LodPrecision *lodPrec,qpWatchDog *watchDog)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int y_;
  float *pfVar6;
  float width;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float z_;
  TextureCubeArrayView TVar17;
  float local_394;
  float local_360;
  Vec4 local_324;
  Vector<float,_2> local_314;
  Vec2 local_30c;
  Vec2 local_304;
  Vec2 clampedLod;
  Vec2 lodO;
  Vec3 coordDyo;
  Vec3 coordDxo;
  Vec3 coordO;
  float nyo;
  float nxo;
  float wyo;
  float wxo;
  int lodOffsNdx;
  Vector<float,_2> local_2b0;
  Vec2 lodBounds;
  Vec3 coordDy;
  Vec3 coordDx;
  Vec4 coord;
  float triNy;
  float triNx;
  float triWy;
  float triWx;
  int triNdx;
  bool isOk;
  bool tri1;
  bool tri0;
  float ny;
  float nx;
  float wy;
  float wx;
  Vector<float,_4> local_248;
  Vector<bool,_4> local_238;
  undefined1 local_234 [16];
  Vector<float,_4> local_224;
  undefined1 local_214 [8];
  Vec4 refPix;
  Vector<float,_4> local_1f4;
  undefined1 local_1e4 [8];
  Vec4 resPix;
  int px;
  int py;
  Vector<float,_2> local_1b8;
  Vec2 lodOffsets [8];
  int numFailed;
  float posEps;
  Vec2 lodBias;
  Vec3 triW [2];
  undefined1 local_148 [8];
  Vec3 triQ [2];
  undefined1 local_128 [8];
  Vec3 triR [2];
  undefined1 local_108 [8];
  Vec3 triT [2];
  undefined1 local_e8 [8];
  Vec3 triS [2];
  int srcSize;
  float dstH;
  float dstW;
  IVec2 dstSize;
  Vec4 qq;
  Vec4 rq;
  Vec4 tq;
  Vec4 sq;
  TextureCubeArrayView local_70;
  undefined1 local_60 [8];
  TextureCubeArrayView src;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  ReferenceParams *sampleParams_local;
  float *texCoord_local;
  TextureCubeArrayView *baseView_local;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *reference_local;
  ConstPixelBufferAccess *result_local;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  TVar17 = getSubView(baseView,sampleParams->baseLevel,sampleParams->maxLevel);
  local_70.m_levels = TVar17.m_levels;
  local_70.m_numLevels = TVar17.m_numLevels;
  TVar17 = tcu::getEffectiveTextureView
                     (&local_70,
                      (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                       *)&src.m_levels,&sampleParams->sampler);
  src._0_8_ = TVar17.m_levels;
  local_60._0_4_ = TVar17.m_numLevels;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(tq.m_data + 2),*texCoord,texCoord[4],texCoord[8],texCoord[0xc]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(rq.m_data + 2),texCoord[1],texCoord[5],texCoord[9],texCoord[0xd]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(qq.m_data + 2),texCoord[2],texCoord[6],texCoord[10],texCoord[0xe])
  ;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&dstSize,texCoord[3],texCoord[7],texCoord[0xb],texCoord[0xf]);
  iVar5 = tcu::ConstPixelBufferAccess::getWidth(result);
  y_ = tcu::ConstPixelBufferAccess::getHeight(result);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&dstH,iVar5,y_);
  iVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&dstH);
  width = (float)iVar5;
  iVar5 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&dstH);
  triS[1].m_data[2] = (float)iVar5;
  triS[1].m_data[1] = (float)tcu::TextureCubeArrayView::getSize((TextureCubeArrayView *)local_60);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_e8,(int)&tq + 8,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triS[0].m_data + 1),(int)&tq + 8,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_108,(int)&rq + 8,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triT[0].m_data + 1),(int)&rq + 8,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_128,(int)&qq + 8,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triR[0].m_data + 1),(int)&qq + 8,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_148,(int)&dstSize,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triQ[0].m_data + 1),(int)&dstSize,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&lodBias,(int)sampleParams + 0xc,0,1);
  tcu::Vector<float,_4>::swizzle
            ((Vector<float,_4> *)(triW[0].m_data + 1),(int)sampleParams + 0xc,3,2);
  if (((sampleParams->super_RenderParams).flags & 2) == 0) {
    local_360 = 0.0;
  }
  else {
    local_360 = (sampleParams->super_RenderParams).bias;
  }
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&numFailed,local_360);
  lodOffsets[7].m_data[1] = 0.05882353;
  lodOffsets[7].m_data[0] = 0.0;
  tcu::Vector<float,_2>::Vector(&local_1b8,-1.0,0.0);
  tcu::Vector<float,_2>::Vector(lodOffsets,1.0,0.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 1,0.0,-1.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 2,0.0,1.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 3,-1.0,-1.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 4,-1.0,1.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 5,1.0,-1.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 6,1.0,1.0);
  tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&py);
  tcu::clear(errorMask,(Vec4 *)&py);
  resPix.m_data[3] = 0.0;
  do {
    fVar7 = resPix.m_data[3];
    iVar5 = tcu::ConstPixelBufferAccess::getHeight(result);
    fVar8 = lodOffsets[7].m_data[0];
    if (iVar5 <= (int)fVar7) {
      std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      ~vector((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
              &src.m_levels);
      return (int)fVar8;
    }
    if (watchDog != (qpWatchDog *)0x0) {
      qpWatchDog_touch(watchDog);
    }
    for (resPix.m_data[2] = 0.0; fVar7 = resPix.m_data[2],
        iVar5 = tcu::ConstPixelBufferAccess::getWidth(result), (int)fVar7 < iVar5;
        resPix.m_data[2] = (float)((int)resPix.m_data[2] + 1)) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(refPix.m_data + 2),(int)result,(int)resPix.m_data[2],
                 (int)resPix.m_data[3]);
      tcu::operator-((tcu *)&local_1f4,(Vector<float,_4> *)(refPix.m_data + 2),
                     &(sampleParams->super_RenderParams).colorBias);
      tcu::operator/((tcu *)local_1e4,&local_1f4,&(sampleParams->super_RenderParams).colorScale);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_234,(int)reference,(int)resPix.m_data[2],
                 (int)resPix.m_data[3]);
      tcu::operator-((tcu *)&local_224,(Vector<float,_4> *)local_234,
                     &(sampleParams->super_RenderParams).colorBias);
      tcu::operator/((tcu *)local_214,&local_224,&(sampleParams->super_RenderParams).colorScale);
      tcu::operator-((tcu *)&wy,(Vector<float,_4> *)local_1e4,(Vector<float,_4> *)local_214);
      tcu::abs<float,4>((tcu *)&local_248,(Vector<float,_4> *)&wy);
      tcu::lessThanEqual<float,4>((tcu *)&local_238,&local_248,&lookupPrec->colorThreshold);
      bVar3 = tcu::boolAll<4>(&local_238);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        fVar7 = (float)(int)resPix.m_data[2] + 0.5;
        fVar8 = (float)(int)resPix.m_data[3] + 0.5;
        fVar9 = fVar7 / width;
        fVar10 = fVar8 / triS[1].m_data[2];
        bVar3 = false;
        for (triWy = (float)(uint)(1.0 < (fVar9 + fVar10) - 0.05882353);
            (int)triWy <= (int)(uint)(1.0 <= fVar9 + fVar10 + 0.05882353);
            triWy = (float)((int)triWy + 1)) {
          local_394 = fVar10;
          fVar1 = fVar8;
          fVar2 = fVar7;
          fVar15 = fVar9;
          if (triWy != 0.0) {
            local_394 = 1.0 - fVar10;
            fVar1 = triS[1].m_data[2] - fVar8;
            fVar2 = width - fVar7;
            fVar15 = 1.0 - fVar9;
          }
          fVar11 = projectedTriInterpolate
                             ((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar15,local_394);
          fVar12 = projectedTriInterpolate
                             ((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar15,local_394);
          fVar13 = projectedTriInterpolate
                             ((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar15,local_394);
          fVar14 = projectedTriInterpolate
                             ((Vec3 *)(triQ[(long)(int)triWy + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar15,local_394);
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)(coordDx.m_data + 1),fVar11,fVar12,fVar13,fVar14);
          fVar11 = triDerivateX((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar7,width,
                                local_394);
          fVar12 = triDerivateX((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar7,width,
                                local_394);
          fVar13 = triDerivateX((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar7,width,
                                local_394);
          tcu::Vector<float,_3>::Vector
                    ((Vector<float,_3> *)(coordDy.m_data + 1),fVar11,fVar12,fVar13);
          fVar11 = triDerivateY((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar8,
                                triS[1].m_data[2],fVar15);
          fVar12 = triDerivateY((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar8,
                                triS[1].m_data[2],fVar15);
          fVar15 = triDerivateY((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar8,
                                triS[1].m_data[2],fVar15);
          tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&lodBounds,fVar11,fVar12,fVar15);
          tcu::Vector<float,_4>::toWidth<3>((Vector<float,_4> *)&wxo);
          tcu::computeCubeLodBoundsFromDerivates
                    ((tcu *)&local_2b0,(Vec3 *)&wxo,(Vec3 *)(coordDy.m_data + 1),(Vec3 *)&lodBounds,
                     (int)triS[1].m_data[1],lodPrec);
          for (wyo = 0.0; (int)wyo < 8; wyo = (float)((int)wyo + 1)) {
            fVar15 = tcu::Vector<float,_2>::x(lodOffsets + (long)(int)wyo + -1);
            fVar15 = fVar2 + fVar15;
            fVar11 = tcu::Vector<float,_2>::y(lodOffsets + (long)(int)wyo + -1);
            fVar11 = fVar1 + fVar11;
            fVar12 = fVar15 / width;
            fVar13 = fVar11 / triS[1].m_data[2];
            fVar14 = projectedTriInterpolate
                               ((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar12,fVar13);
            fVar16 = projectedTriInterpolate
                               ((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar12,fVar13);
            z_ = projectedTriInterpolate
                           ((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                            (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar12,fVar13);
            tcu::Vector<float,_3>::Vector
                      ((Vector<float,_3> *)(coordDxo.m_data + 1),fVar14,fVar16,z_);
            fVar14 = triDerivateX((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar15,width,
                                  fVar13);
            fVar16 = triDerivateX((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar15,width,
                                  fVar13);
            fVar15 = triDerivateX((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar15,width,
                                  fVar13);
            tcu::Vector<float,_3>::Vector
                      ((Vector<float,_3> *)(coordDyo.m_data + 1),fVar14,fVar16,fVar15);
            fVar15 = triDerivateY((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar11,
                                  triS[1].m_data[2],fVar12);
            fVar13 = triDerivateY((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar11,
                                  triS[1].m_data[2],fVar12);
            fVar11 = triDerivateY((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar11,
                                  triS[1].m_data[2],fVar12);
            tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&lodO,fVar15,fVar13,fVar11);
            tcu::computeCubeLodBoundsFromDerivates
                      ((tcu *)&clampedLod,(Vec3 *)(coordDxo.m_data + 1),
                       (Vec3 *)(coordDyo.m_data + 1),(Vec3 *)&lodO,(int)triS[1].m_data[1],lodPrec);
            pfVar6 = tcu::Vector<float,_2>::x(&local_2b0);
            fVar15 = *pfVar6;
            fVar11 = tcu::Vector<float,_2>::x(&clampedLod);
            fVar15 = de::min<float>(fVar15,fVar11);
            pfVar6 = tcu::Vector<float,_2>::x(&local_2b0);
            *pfVar6 = fVar15;
            pfVar6 = tcu::Vector<float,_2>::y(&local_2b0);
            fVar15 = *pfVar6;
            fVar11 = tcu::Vector<float,_2>::y(&clampedLod);
            fVar15 = de::max<float>(fVar15,fVar11);
            pfVar6 = tcu::Vector<float,_2>::y(&local_2b0);
            *pfVar6 = fVar15;
          }
          tcu::operator+((tcu *)&local_30c,&local_2b0,(Vector<float,_2> *)&numFailed);
          tcu::Vector<float,_2>::Vector(&local_314,sampleParams->minLod,sampleParams->maxLod);
          tcu::clampLodBounds((tcu *)&local_304,&local_30c,&local_314,lodPrec);
          bVar4 = tcu::isLookupResultValid
                            ((TextureCubeArrayView *)local_60,&sampleParams->sampler,lookupPrec,
                             coordBits,(Vec4 *)(coordDx.m_data + 1),&local_304,(Vec4 *)local_1e4);
          if (bVar4) {
            bVar3 = true;
            break;
          }
        }
        if (!bVar3) {
          tcu::RGBA::red();
          tcu::RGBA::toVec((RGBA *)&local_324);
          tcu::PixelBufferAccess::setPixel
                    (errorMask,&local_324,(int)resPix.m_data[2],(int)resPix.m_data[3],0);
          lodOffsets[7].m_data[0] = (float)((int)lodOffsets[7].m_data[0] + 1);
        }
      }
    }
    resPix.m_data[3] = (float)((int)resPix.m_data[3] + 1);
  } while( true );
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::TextureCubeArrayView&		baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::IVec4&						coordBits,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::TextureCubeArrayView				src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[4+0], texCoord[8+0], texCoord[12+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[4+1], texCoord[8+1], texCoord[12+1]);
	const tcu::Vec4								rq					= tcu::Vec4(texCoord[0+2], texCoord[4+2], texCoord[8+2], texCoord[12+2]);
	const tcu::Vec4								qq					= tcu::Vec4(texCoord[0+3], texCoord[4+3], texCoord[8+3], texCoord[12+3]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const int									srcSize				= src.getSize();

	// Coordinates per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triQ[2]				= { qq.swizzle(0, 1, 2), qq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	const float									posEps				= 1.0f / float((1<<4) + 1); // ES3 requires at least 4 subpixel bits.

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),

		// \note Not strictly allowed by spec, but implementations do this in practice.
		tcu::Vec2(-1, -1),
		tcu::Vec2(-1, +1),
		tcu::Vec2(+1, -1),
		tcu::Vec2(+1, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const bool		tri0	= nx + ny - posEps <= 1.0f;
				const bool		tri1	= nx + ny + posEps >= 1.0f;

				bool			isOk	= false;

				DE_ASSERT(tri0 || tri1);

				// Pixel can belong to either of the triangles if it lies close enough to the edge.
				for (int triNdx = (tri0?0:1); triNdx <= (tri1?1:0); triNdx++)
				{
					const float		triWx		= triNdx ? dstW - wx : wx;
					const float		triWy		= triNdx ? dstH - wy : wy;
					const float		triNx		= triNdx ? 1.0f - nx : nx;
					const float		triNy		= triNdx ? 1.0f - ny : ny;

					const tcu::Vec4	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triQ[triNdx], triW[triNdx], triNx, triNy));
					const tcu::Vec3	coordDx		(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
												 triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
												 triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy));
					const tcu::Vec3	coordDy		(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
												 triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
												 triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx));

					tcu::Vec2		lodBounds	= tcu::computeCubeLodBoundsFromDerivates(coord.toWidth<3>(), coordDx, coordDy, srcSize, lodPrec);

					// Compute lod bounds across lodOffsets range.
					for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
					{
						const float		wxo			= triWx + lodOffsets[lodOffsNdx].x();
						const float		wyo			= triWy + lodOffsets[lodOffsNdx].y();
						const float		nxo			= wxo/dstW;
						const float		nyo			= wyo/dstH;

						const tcu::Vec3	coordO		(projectedTriInterpolate(triS[triNdx], triW[triNdx], nxo, nyo),
													 projectedTriInterpolate(triT[triNdx], triW[triNdx], nxo, nyo),
													 projectedTriInterpolate(triR[triNdx], triW[triNdx], nxo, nyo));
						const tcu::Vec3	coordDxo	(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
													 triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo),
													 triDerivateX(triR[triNdx], triW[triNdx], wxo, dstW, nyo));
						const tcu::Vec3	coordDyo	(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
													 triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo),
													 triDerivateY(triR[triNdx], triW[triNdx], wyo, dstH, nxo));
						const tcu::Vec2	lodO		= tcu::computeCubeLodBoundsFromDerivates(coordO, coordDxo, coordDyo, srcSize, lodPrec);

						lodBounds.x() = de::min(lodBounds.x(), lodO.x());
						lodBounds.y() = de::max(lodBounds.y(), lodO.y());
					}

					const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);

					if (tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coordBits, coord, clampedLod, resPix))
					{
						isOk = true;
						break;
					}
				}

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}